

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

bool miniros::last_socket_error_is_would_block(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  if ((*piVar1 != 0xb) && (piVar1 = __errno_location(), *piVar1 != 0xb)) {
    return false;
  }
  return true;
}

Assistant:

bool last_socket_error_is_would_block()
{
#if defined(WIN32)
  if (WSAGetLastError() == WSAEWOULDBLOCK) {
    return true;
  } else {
    return false;
  }
#else
  if ((errno == EAGAIN) || (errno == EWOULDBLOCK)) { // posix permits either
    return true;
  } else {
    return false;
  }
#endif
}